

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReader::MetaData::Entry::clear(Entry *this)

{
  if (this->isLmd == true) {
    this->isLmd = false;
    if (this->lmdData != (LargeMetaData *)0x0) {
      (*this->lmdData->_vptr_LargeMetaData[1])();
      this->lmdData = (LargeMetaData *)0x0;
    }
    this->lmdPos = 0;
    this->lmdZipSize = 0;
  }
  else if (this->data != (char *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (char *)0x0;
  return;
}

Assistant:

void clear() {
		if (isLmd) {
		    isLmd = 0;
		    if (lmdData) { delete lmdData; lmdData = 0; }
		    lmdPos = 0;
		    lmdZipSize = 0;
		}
		else {
		    if (data) { delete [] data; }
		}
                data = 0;
	    }